

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cc
# Opt level: O0

void __thiscall
prometheus::detail::Endpoint::RegisterAuth
          (Endpoint *this,
          function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *authCB,string *realm)

{
  CivetServer *this_00;
  pointer handler;
  unique_ptr<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
  local_28;
  unique_ptr<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
  new_handler;
  string *realm_local;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *authCB_local;
  Endpoint *this_local;
  
  new_handler._M_t.
  super___uniq_ptr_impl<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
  ._M_t.
  super__Tuple_impl<0UL,_prometheus::BasicAuthHandler_*,_std::default_delete<prometheus::BasicAuthHandler>_>
  .super__Head_base<0UL,_prometheus::BasicAuthHandler_*,_false>._M_head_impl =
       (__uniq_ptr_data<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>,_true,_true>
        )(__uniq_ptr_data<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>,_true,_true>
          )realm;
  make_unique<prometheus::BasicAuthHandler,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::__cxx11::string_const&>
            ((detail *)&local_28,authCB,realm);
  this_00 = this->server_;
  handler = std::
            unique_ptr<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
            ::get(&local_28);
  CivetServer::addAuthHandler(this_00,&this->uri_,&handler->super_CivetAuthHandler);
  std::unique_ptr<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
  ::operator=(&this->auth_handler_,&local_28);
  std::unique_ptr<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
  ::~unique_ptr(&local_28);
  return;
}

Assistant:

void Endpoint::RegisterAuth(
    std::function<bool(const std::string&, const std::string&)> authCB,
    const std::string& realm) {
  // split creating, assigning, and storing to avoid a race-condition when
  // being called the second time and the handler is replaced
  auto new_handler =
      detail::make_unique<BasicAuthHandler>(std::move(authCB), realm);
  server_.addAuthHandler(uri_, new_handler.get());
  auth_handler_ = std::move(new_handler);
}